

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O2

int If_Dec6PickBestMux(word t,word *Cofs)

{
  int iVar1;
  int iVar2;
  word wVar3;
  int iVar4;
  int iVar;
  int local_3c;
  
  iVar4 = 1000;
  local_3c = -1;
  for (iVar = 0; iVar != 6; iVar = iVar + 1) {
    wVar3 = If_Dec6Cofactor(t,iVar,0);
    iVar1 = If_Dec6SuppSize(wVar3);
    wVar3 = If_Dec6Cofactor(t,iVar,1);
    iVar2 = If_Dec6SuppSize(wVar3);
    if ((iVar2 < 5 && iVar1 < 5) && (iVar2 + iVar1 < iVar4)) {
      wVar3 = If_Dec6Cofactor(t,iVar,0);
      *Cofs = wVar3;
      wVar3 = If_Dec6Cofactor(t,iVar,1);
      Cofs[1] = wVar3;
      iVar4 = iVar2 + iVar1;
      local_3c = iVar;
    }
  }
  return local_3c;
}

Assistant:

int If_Dec6PickBestMux( word t, word Cofs[2] )
{
    int v, vBest = -1, Count0, Count1, CountBest = 1000;
    for ( v = 0; v < 6; v++ )
    {
        Count0 = If_Dec6SuppSize( If_Dec6Cofactor(t, v, 0) );
        Count1 = If_Dec6SuppSize( If_Dec6Cofactor(t, v, 1) );
        if ( Count0 < 5 && Count1 < 5 && CountBest > Count0 + Count1 )
        {
            CountBest = Count0 + Count1;
            vBest = v;
            Cofs[0] = If_Dec6Cofactor(t, v, 0);
            Cofs[1] = If_Dec6Cofactor(t, v, 1);
        }
    }
    return vBest;
}